

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void __thiscall
glu::sl::ShaderParser::parseValueElement(ShaderParser *this,DataType expectedDataType,Value *result)

{
  Token TVar1;
  DataType DVar2;
  uint uVar3;
  int iVar4;
  undefined8 extraout_RAX;
  Element EVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  double dVar11;
  Element elems [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  DVar2 = getDataTypeScalarType(expectedDataType);
  uVar3 = getDataTypeScalarSize(expectedDataType);
  if (1 < (int)uVar3) {
    advanceToken(this);
    advanceToken(this,TOKEN_LEFT_PAREN);
  }
  uVar9 = 0;
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  do {
    if (uVar8 == uVar9) {
      if (1 < (int)uVar3) {
        advanceToken(this,TOKEN_RIGHT_PAREN);
      }
      for (lVar7 = 0; uVar8 * 4 != lVar7; lVar7 = lVar7 + 4) {
        std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::push_back
                  (&result->elements,(value_type *)((long)elems + lVar7));
      }
      return;
    }
    TVar1 = this->m_curToken;
    if (DVar2 == TYPE_FLOAT) {
      fVar10 = 1.0;
      if (TVar1 == TOKEN_MINUS) {
        advanceToken(this);
        fVar10 = -1.0;
      }
      assumeToken(this,TOKEN_FLOAT_LITERAL);
      dVar11 = atof((this->m_curTokenStr)._M_dataplus._M_p);
      elems[uVar9].float32 = (float)dVar11 * fVar10;
      advanceToken(this,TOKEN_FLOAT_LITERAL);
    }
    else if ((DVar2 & ~TYPE_FLOAT_VEC4) == TYPE_INT) {
      iVar6 = 1;
      if (TVar1 == TOKEN_MINUS) {
        advanceToken(this);
        iVar6 = -1;
      }
      assumeToken(this,TOKEN_INT_LITERAL);
      iVar4 = atoi((this->m_curTokenStr)._M_dataplus._M_p);
      elems[uVar9].int32 = iVar4 * iVar6;
      advanceToken(this,TOKEN_INT_LITERAL);
    }
    else {
      EVar5.int32._1_3_ = 0;
      EVar5.int32._0_1_ = TVar1 == TOKEN_TRUE;
      elems[uVar9] = EVar5;
      if (1 < TVar1 - TOKEN_TRUE) {
        std::operator+(&local_50,"unexpected token, expecting bool: ",&this->m_curTokenStr);
        parseError(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        _Unwind_Resume(extraout_RAX);
      }
      advanceToken(this);
    }
    if (uVar3 - 1 != uVar9) {
      advanceToken(this,TOKEN_COMMA);
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void ShaderParser::parseValueElement (DataType expectedDataType, Value& result)
{
	DataType	scalarType	= getDataTypeScalarType(expectedDataType);
	int			scalarSize	= getDataTypeScalarSize(expectedDataType);

	/* \todo [2010-04-19 petri] Support arrays. */
	Value::Element elems[16];

	if (scalarSize > 1)
	{
		DE_ASSERT(mapDataTypeToken(m_curToken) == expectedDataType);
		advanceToken(); // data type (float, vec2, etc.)
		advanceToken(TOKEN_LEFT_PAREN);
	}

	for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
	{
		if (scalarType == TYPE_FLOAT)
		{
			float signMult = 1.0f;
			if (m_curToken == TOKEN_MINUS)
			{
				signMult = -1.0f;
				advanceToken();
			}

			assumeToken(TOKEN_FLOAT_LITERAL);
			elems[scalarNdx].float32 = signMult * parseFloatLiteral(m_curTokenStr.c_str());
			advanceToken(TOKEN_FLOAT_LITERAL);
		}
		else if (scalarType == TYPE_INT || scalarType == TYPE_UINT)
		{
			int signMult = 1;
			if (m_curToken == TOKEN_MINUS)
			{
				signMult = -1;
				advanceToken();
			}

			assumeToken(TOKEN_INT_LITERAL);
			elems[scalarNdx].int32 = signMult * parseIntLiteral(m_curTokenStr.c_str());
			advanceToken(TOKEN_INT_LITERAL);
		}
		else
		{
			DE_ASSERT(scalarType == TYPE_BOOL);
			elems[scalarNdx].bool32 = (m_curToken == TOKEN_TRUE);
			if (m_curToken != TOKEN_TRUE && m_curToken != TOKEN_FALSE)
				parseError(string("unexpected token, expecting bool: " + m_curTokenStr));
			advanceToken(); // true/false
		}

		if (scalarNdx != (scalarSize - 1))
			advanceToken(TOKEN_COMMA);
	}

	if (scalarSize > 1)
		advanceToken(TOKEN_RIGHT_PAREN);

	// Store results.
	for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
		result.elements.push_back(elems[scalarNdx]);
}